

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yamc_barrier.hpp
# Opt level: O2

__pid_t __thiscall
yamc::barrier<yamc::detail::default_barrier_completion>::wait
          (barrier<yamc::detail::default_barrier_completion> *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->mtx_);
  while (this->phase_ <= *__stat_loc) {
    std::condition_variable::wait((unique_lock *)&this->cv_);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return extraout_EAX;
}

Assistant:

void wait(arrival_token&& arrival) const
  {
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    while (phase_ <= arrival.phase_) {
      cv_.wait(lk);
    }
  }